

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestDiagnosticInternal::TestDiagnosticInternal
          (TestDiagnosticInternal *this,TestRegistry *r,string *name)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  testinator::Test::Test(&this->super_Test,r,name,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00177cb0;
  return;
}

Assistant:

TestDiagnosticInternal(testinator::TestRegistry& r, const string& name)
    : testinator::Test(r, name)
  {}